

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<unsigned_char> * __thiscall
testing::internal::MatcherBase<unsigned_char>::operator=
          (MatcherBase<unsigned_char> *this,MatcherBase<unsigned_char> *other)

{
  MatcherBase<unsigned_char> *other_local;
  MatcherBase<unsigned_char> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }